

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_atomic_test.c
# Opt level: O3

char * test_recorded_values(void)

{
  _Bool _Var1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  hdr_iter iter;
  hdr_iter local_b0;
  
  load_histograms();
  hdr_iter_recorded_init(&local_b0,raw_histogram);
  _Var1 = hdr_iter_next(&local_b0);
  pcVar2 = "Should have encountered 2 values";
  if (_Var1) {
    iVar3 = 0;
    do {
      if (iVar3 == 0) {
        if (local_b0.specifics.linear.value_units_per_bucket != 10000) {
          return "Value at 0 is not 10000";
        }
      }
      else if (local_b0.specifics.linear.value_units_per_bucket != 1) {
        return "Value at 1 is not 1";
      }
      iVar3 = iVar3 + 1;
      _Var1 = hdr_iter_next(&local_b0);
    } while (_Var1);
    if (iVar3 == 2) {
      hdr_iter_recorded_init(&local_b0,cor_histogram);
      _Var1 = hdr_iter_next(&local_b0);
      if (_Var1) {
        iVar3 = 0;
        lVar4 = 0;
        do {
          bVar5 = iVar3 == 0;
          iVar3 = iVar3 + -1;
          if (local_b0.specifics.linear.value_units_per_bucket != 10000 && bVar5) {
            return "Count at 0 is not 10000";
          }
          if (local_b0.count == 0) {
            return "Count should not be 0";
          }
          if (local_b0.count != local_b0.specifics.linear.value_units_per_bucket) {
            return "Count at value iterated to should be count added in this step";
          }
          lVar4 = lVar4 + local_b0.specifics.linear.value_units_per_bucket;
          _Var1 = hdr_iter_next(&local_b0);
        } while (_Var1);
        pcVar2 = (char *)0x0;
        if (lVar4 != 20000) {
          pcVar2 = "Total counts should be 20000";
        }
      }
      else {
        pcVar2 = "Total counts should be 20000";
      }
    }
  }
  return pcVar2;
}

Assistant:

static char* test_recorded_values(void)
{
    struct hdr_iter iter;
    int index;
    int64_t total_added_count = 0;

    load_histograms();

    /* Raw Histogram */
    hdr_iter_recorded_init(&iter, raw_histogram);

    index = 0;
    while (hdr_iter_next(&iter))
    {
        int64_t count_added_in_this_bucket = iter.specifics.recorded.count_added_in_this_iteration_step;
        if (index == 0)
        {
            mu_assert("Value at 0 is not 10000", count_added_in_this_bucket == 10000);
        }
        else
        {
            mu_assert("Value at 1 is not 1", count_added_in_this_bucket == 1);
        }

        index++;
    }
    mu_assert("Should have encountered 2 values", index == 2);

    /* Corrected Histogram */
    hdr_iter_recorded_init(&iter, cor_histogram);

    index = 0;
    while (hdr_iter_next(&iter))
    {
        int64_t count_added_in_this_bucket = iter.specifics.recorded.count_added_in_this_iteration_step;
        if (index == 0)
        {
            mu_assert("Count at 0 is not 10000", count_added_in_this_bucket == 10000);
        }
        mu_assert("Count should not be 0", iter.count != 0);
        mu_assert("Count at value iterated to should be count added in this step",
                  iter.count == count_added_in_this_bucket);
        total_added_count += count_added_in_this_bucket;
        index++;
    }
    mu_assert("Total counts should be 20000", total_added_count == 20000);

    return 0;
}